

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNTests.cpp
# Opt level: O2

void __thiscall IsNotNaNTests::ThenIsNotNanXIsNotTrue<double>(IsNotNaNTests *this,double value)

{
  allocator local_133;
  allocator local_132;
  allocator local_131;
  void *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_130 = (void *)value;
  std::__cxx11::string::string((string *)&local_c8,"Is::Not::NaN(",&local_131);
  std::__cxx11::string::string((string *)&local_e8,__exception + (*__exception == '*'),&local_132);
  std::operator+(&local_a8,&local_c8,&local_e8);
  std::operator+(&local_88,&local_a8,": ");
  ut11::utility::ToString<double>(&local_108,(double *)&local_130);
  std::operator+(&local_68,&local_88,&local_108);
  std::__cxx11::string::string((string *)&local_128,") is Not True",&local_133);
  std::operator+(&local_48,&local_68,&local_128);
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = local_130;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:63:141)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:63:141)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void ThenIsNotNanXIsNotTrue(T value)
	{
		Then(std::string("Is::Not::NaN(") + std::string(typeid(T).name()) + ": " + ut11::utility::ToString(value) + std::string(") is Not True"), [value]() {
			AssertThat(ut11::Is::Not::NaN(value), ut11::Is::Not::True);
		});
	}